

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O0

void __thiscall
cs::statement_function::statement_function
          (statement_function *this,string *name,string *decl,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body,
          bool is_override,bool is_vargs,context_t *c,token_base *ptr)

{
  string *in_RDX;
  string *in_RSI;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_RDI;
  byte in_R9B;
  byte in_stack_00000008;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  context_t *in_stack_fffffffffffffec8;
  statement_base *in_stack_fffffffffffffed0;
  _Elt_pointer *pppsVar1;
  undefined2 uVar2;
  statement_base *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  context_t *in_stack_ffffffffffffff28;
  function *in_stack_ffffffffffffff30;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff78;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_ffffffffffffff80;
  string local_70 [70];
  byte local_2a;
  byte local_29;
  string *local_18;
  
  local_29 = in_R9B & 1;
  local_2a = in_stack_00000008 & 1;
  local_18 = in_RDX;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (shared_ptr<cs::context_type> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  statement_base::statement_base
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (token_base *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x2581dd);
  (in_RDI->super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>)._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)&PTR__statement_function_003df708;
  pppsVar1 = &(in_RDI->
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
              _M_impl.super__Deque_impl_data._M_start._M_last;
  std::__cxx11::string::string((string *)pppsVar1,in_RSI);
  uVar2 = (undefined2)((ulong)pppsVar1 >> 0x30);
  pppsVar1 = &(in_RDI->
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_last;
  std::shared_ptr<cs::context_type>::shared_ptr
            ((shared_ptr<cs::context_type> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (shared_ptr<cs::context_type> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  std::__cxx11::string::string(local_70,local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pppsVar1,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  cs::function::function
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)pppsVar1,in_RDI,SUB21((ushort)uVar2 >> 8,0),SUB21(uVar2,0));
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)pppsVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffed0);
  std::__cxx11::string::~string(local_70);
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x2582de);
  *(byte *)&in_RDI[3].super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>
            ._M_impl.super__Deque_impl_data._M_map_size = local_29 & 1;
  *(undefined1 *)
   ((long)&in_RDI[3].super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
           _M_impl.super__Deque_impl_data._M_map_size + 1) = 0;
  std::__cxx11::string::string
            ((string *)
             &in_RDI[3].
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start,local_18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pppsVar1,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

statement_function(std::string name, const std::string &decl, const std::vector<std::string> &args,
		                   const std::deque<statement_base *> &body, bool is_override, bool is_vargs,
		                   const context_t &c,
		                   token_base *ptr)
			: statement_base(c, ptr), mName(std::move(name)), mFunc(c, decl, this, args, body, is_vargs),
			  mOverride(is_override), mDecl(decl), mArgs(args), mBlock(body) {}